

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

DTLSIncomingMessage *
bssl::dtls1_get_incoming_message(SSL *ssl,uint8_t *out_alert,hm_header_st *msg_hdr)

{
  bool bVar1;
  size_t sVar2;
  unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter> local_40;
  pointer local_38;
  DTLSIncomingMessage *frag;
  size_t idx;
  hm_header_st *msg_hdr_local;
  uint8_t *out_alert_local;
  SSL *ssl_local;
  
  if ((msg_hdr->seq < ssl->d1->handshake_read_seq) ||
     (6 < (int)((uint)msg_hdr->seq - (uint)ssl->d1->handshake_read_seq))) {
    *out_alert = 'P';
    ssl_local = (SSL *)0x0;
  }
  else {
    frag = (DTLSIncomingMessage *)(long)(int)((uint)msg_hdr->seq % 7);
    idx = (size_t)msg_hdr;
    msg_hdr_local = (hm_header_st *)out_alert;
    out_alert_local = (uint8_t *)ssl;
    local_38 = std::unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::get
                         (ssl->d1->incoming_messages + (long)frag);
    if (local_38 == (pointer)0x0) {
      dtls_new_incoming_message((bssl *)&local_40,(hm_header_st *)idx);
      std::unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::operator=
                ((unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter> *)
                 (*(long *)(out_alert_local + 0x38) + 0x118 + (long)frag * 8),&local_40);
      std::unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::~unique_ptr(&local_40);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr *)(*(long *)(out_alert_local + 0x38) + 0x118 + (long)frag * 8))
      ;
      if (bVar1) {
        ssl_local = (SSL *)std::unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::get
                                     ((unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>
                                       *)(*(long *)(out_alert_local + 0x38) + 0x118 + (long)frag * 8
                                         ));
      }
      else {
        msg_hdr_local->type = 'P';
        ssl_local = (SSL *)0x0;
      }
    }
    else {
      if (local_38->seq != *(uint16_t *)(idx + 8)) {
        __assert_fail("frag->seq == msg_hdr->seq",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                      ,0xe8,
                      "DTLSIncomingMessage *bssl::dtls1_get_incoming_message(SSL *, uint8_t *, const struct hm_header_st *)"
                     );
      }
      if ((local_38->type == *(uint8_t *)idx) &&
         (sVar2 = DTLSIncomingMessage::msg_len(local_38), sVar2 == *(uint *)(idx + 4))) {
        return local_38;
      }
      ERR_put_error(0x10,0,0x98,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                    ,0xed);
      msg_hdr_local->type = '/';
      ssl_local = (SSL *)0x0;
    }
  }
  return (DTLSIncomingMessage *)ssl_local;
}

Assistant:

static DTLSIncomingMessage *dtls1_get_incoming_message(
    SSL *ssl, uint8_t *out_alert, const struct hm_header_st *msg_hdr) {
  if (msg_hdr->seq < ssl->d1->handshake_read_seq ||
      msg_hdr->seq - ssl->d1->handshake_read_seq >= SSL_MAX_HANDSHAKE_FLIGHT) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return NULL;
  }

  size_t idx = msg_hdr->seq % SSL_MAX_HANDSHAKE_FLIGHT;
  DTLSIncomingMessage *frag = ssl->d1->incoming_messages[idx].get();
  if (frag != NULL) {
    assert(frag->seq == msg_hdr->seq);
    // The new fragment must be compatible with the previous fragments from this
    // message.
    if (frag->type != msg_hdr->type ||  //
        frag->msg_len() != msg_hdr->msg_len) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_FRAGMENT_MISMATCH);
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      return NULL;
    }
    return frag;
  }

  // This is the first fragment from this message.
  ssl->d1->incoming_messages[idx] = dtls_new_incoming_message(msg_hdr);
  if (!ssl->d1->incoming_messages[idx]) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return NULL;
  }
  return ssl->d1->incoming_messages[idx].get();
}